

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          char *substr)

{
  TestPartResultArray *this;
  TestPartResult *pTVar1;
  Message *pMVar2;
  scoped_ptr<testing::internal::String> extraout_RDX;
  int i;
  int index;
  char *pcVar3;
  undefined4 in_register_00000084;
  AssertionResult AVar4;
  Message msg;
  String expected;
  Message local_50;
  String local_48;
  int local_34;
  
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar3 = "1 non-fatal failure";
  if ((Type)substr == kFatalFailure) {
    pcVar3 = "1 fatal failure";
  }
  String::String(&local_48,pcVar3);
  Message::Message(&local_50);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == (Type)substr) {
      pcVar3 = strstr((pTVar1->message_).c_str_,(char *)msg.ss_);
      if (pcVar3 != (char *)0x0) {
        *param_1 = '\x01';
        param_1[8] = '\0';
        param_1[9] = '\0';
        param_1[10] = '\0';
        param_1[0xb] = '\0';
        param_1[0xc] = '\0';
        param_1[0xd] = '\0';
        param_1[0xe] = '\0';
        param_1[0xf] = '\0';
        goto LAB_00153eaa;
      }
      pMVar2 = Message::operator<<(&local_50,(char (*) [11])0x178ac6);
      pMVar2 = Message::operator<<(pMVar2,&local_48);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [14])" containing \"");
      pMVar2 = Message::operator<<(pMVar2,(char **)&msg);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x1791ff);
    }
    else {
      pMVar2 = Message::operator<<(&local_50,(char (*) [11])0x178ac6);
      pMVar2 = Message::operator<<(pMVar2,&local_48);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x179141);
    }
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])"  Actual:\n");
    Message::operator<<(pMVar2,pTVar1);
    AssertionFailure((testing *)param_1,&local_50);
  }
  else {
    pMVar2 = Message::operator<<(&local_50,(char (*) [11])0x178ac6);
    pMVar2 = Message::operator<<(pMVar2,&local_48);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x179141);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x178aba);
    local_34 = (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6);
    pMVar2 = Message::operator<<(pMVar2,&local_34);
    Message::operator<<(pMVar2,(char (*) [10])" failures");
    for (index = 0; index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6);
        index = index + 1) {
      pMVar2 = Message::operator<<(&local_50,(char (*) [2])0x179141);
      pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
      Message::operator<<(pMVar2,pTVar1);
    }
    AssertionFailure((testing *)param_1,&local_50);
  }
LAB_00153eaa:
  if (local_50.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_50.ss_ + 8))();
  }
  String::~String(&local_48);
  AVar4.message_.ptr_ = extraout_RDX.ptr_;
  AVar4._0_8_ = param_1;
  return AVar4;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const char* substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure(msg);
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    msg << "Expected: " << expected << "\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  if (strstr(r.message(), substr) == NULL) {
    msg << "Expected: " << expected << " containing \""
        << substr << "\"\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  return AssertionSuccess();
}